

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

void __thiscall Cmd::editHistoryNext(Cmd *this,State *state,Direction dir)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  size_t sVar5;
  Direction dir_local;
  State *state_local;
  Cmd *this_local;
  
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->history_);
  if (!bVar2) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->history_);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->history_,~state->history_index + sVar3);
    std::__cxx11::string::operator=((string *)pvVar4,(string *)state);
    if (dir == Next) {
      if (state->history_index == 0) {
        return;
      }
      state->history_index = state->history_index - 1;
    }
    else if (dir == Prev) {
      state->history_index = state->history_index + 1;
      uVar1 = state->history_index;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->history_);
      if (sVar3 <= uVar1) {
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->history_);
        state->history_index = sVar3 - 1;
        return;
      }
    }
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->history_);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->history_,(sVar3 - 1) - state->history_index);
    std::__cxx11::string::operator=((string *)state,(string *)pvVar4);
    sVar5 = std::__cxx11::string::size();
    state->pos = sVar5;
    refreshLine(this,state);
  }
  return;
}

Assistant:

void editHistoryNext(State *state, Direction dir) {

		if (!history_.empty()) {
			// Update the current history entry before to overwrite it with the next one.
			history_[history_.size() - 1 - state->history_index] = state->buf;

			switch (dir) {
			case Direction::Prev:
				++state->history_index;
				if (state->history_index >= history_.size()) {
					state->history_index = history_.size() - 1;
					return;
				}
				break;
			case Direction::Next:
				if (state->history_index == 0) {
					return;
				}
				--state->history_index;
			}

			// Show the new entry
			state->buf = history_[history_.size() - 1 - state->history_index];
			state->pos = state->buf.size();
			refreshLine(state);
		}
	}